

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

Variant * __thiscall
Rml::DataExpressionInterface::GetValue
          (Variant *__return_storage_ptr__,DataExpressionInterface *this,DataAddress *address)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *this_00;
  pointer ppVar4;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_50;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_48;
  const_iterator it;
  Dictionary *parameters;
  DataAddress *address_local;
  DataExpressionInterface *this_local;
  Variant *result;
  
  Variant::Variant(__return_storage_ptr__);
  if ((this->event != (Event *)0x0) &&
     (sVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::size
                        (address), sVar2 == 2)) {
    pvVar3 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                       (address);
    bVar1 = ::std::operator==(&pvVar3->name,"ev");
    if (bVar1) {
      this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                 *)Event::GetParameters_abi_cxx11_(this->event);
      it._M_current = this_00;
      pvVar3 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::back
                         (address);
      local_48._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
            *)itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::find<std::__cxx11::string>
                        ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                          *)this_00,&pvVar3->name);
      local_50._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
            *)itlib::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              ::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               ::operator->(&local_48);
      Variant::operator=(__return_storage_ptr__,&ppVar4->second);
      return __return_storage_ptr__;
    }
  }
  if (this->data_model != (DataModel *)0x0) {
    DataModel::GetVariableInto(this->data_model,address,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Variant DataExpressionInterface::GetValue(const DataAddress& address) const
{
	Variant result;
	if (event && address.size() == 2 && address.front().name == "ev")
	{
		auto& parameters = event->GetParameters();
		auto it = parameters.find(address.back().name);
		if (it != parameters.end())
			result = it->second;
	}
	else if (data_model)
	{
		data_model->GetVariableInto(address, result);
	}
	return result;
}